

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O0

void __thiscall
btBox2dBox2dCollisionAlgorithm::btBox2dBox2dCollisionAlgorithm
          (btBox2dBox2dCollisionAlgorithm *this,btPersistentManifold *mf,
          btCollisionAlgorithmConstructionInfo *ci,btCollisionObjectWrapper *obj0Wrap,
          btCollisionObjectWrapper *obj1Wrap)

{
  byte bVar1;
  btCollisionObject *pbVar2;
  btCollisionObject *pbVar3;
  undefined8 uVar4;
  btCollisionObjectWrapper *in_RCX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  btCollisionObjectWrapper *in_R8;
  btCollisionObjectWrapper *in_stack_ffffffffffffff78;
  btCollisionObjectWrapper *in_stack_ffffffffffffff80;
  btCollisionAlgorithmConstructionInfo *in_stack_ffffffffffffff88;
  btActivatingCollisionAlgorithm *in_stack_ffffffffffffff90;
  long *plVar5;
  
  btActivatingCollisionAlgorithm::btActivatingCollisionAlgorithm
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  *in_RDI = &PTR__btBox2dBox2dCollisionAlgorithm_002e2568;
  *(undefined1 *)(in_RDI + 2) = 0;
  in_RDI[3] = in_RSI;
  if (in_RDI[3] == 0) {
    plVar5 = (long *)in_RDI[1];
    pbVar2 = btCollisionObjectWrapper::getCollisionObject(in_RCX);
    pbVar3 = btCollisionObjectWrapper::getCollisionObject(in_R8);
    bVar1 = (**(code **)(*plVar5 + 0x30))(plVar5,pbVar2,pbVar3);
    if ((bVar1 & 1) != 0) {
      plVar5 = (long *)in_RDI[1];
      pbVar2 = btCollisionObjectWrapper::getCollisionObject(in_RCX);
      pbVar3 = btCollisionObjectWrapper::getCollisionObject(in_R8);
      uVar4 = (**(code **)(*plVar5 + 0x18))(plVar5,pbVar2,pbVar3);
      in_RDI[3] = uVar4;
      *(undefined1 *)(in_RDI + 2) = 1;
    }
  }
  return;
}

Assistant:

btBox2dBox2dCollisionAlgorithm::btBox2dBox2dCollisionAlgorithm(btPersistentManifold* mf,const btCollisionAlgorithmConstructionInfo& ci,const btCollisionObjectWrapper* obj0Wrap,const btCollisionObjectWrapper* obj1Wrap)
: btActivatingCollisionAlgorithm(ci,obj0Wrap,obj1Wrap),
m_ownManifold(false),
m_manifoldPtr(mf)
{
	if (!m_manifoldPtr && m_dispatcher->needsCollision(obj0Wrap->getCollisionObject(),obj1Wrap->getCollisionObject()))
	{
		m_manifoldPtr = m_dispatcher->getNewManifold(obj0Wrap->getCollisionObject(),obj1Wrap->getCollisionObject());
		m_ownManifold = true;
	}
}